

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void al_flush_event_queue(ALLEGRO_EVENT_QUEUE *queue)

{
  uint idx;
  void *pvVar1;
  long in_RDI;
  ALLEGRO_EVENT *old_ev;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  uint i_00;
  
  heartbeat();
  _al_mutex_lock((_AL_MUTEX *)0x1746ec);
  for (idx = *(uint *)(in_RDI + 0x44); idx != *(uint *)(in_RDI + 0x40);
      idx = circ_array_next((_AL_VECTOR *)CONCAT44(idx,in_stack_fffffffffffffff0),i_00)) {
    pvVar1 = _al_vector_ref((_AL_VECTOR *)(in_RDI + 0x20),idx);
    i_00 = (uint)((ulong)pvVar1 >> 0x20);
    unref_if_user_event((ALLEGRO_EVENT *)0x174725);
  }
  *(undefined4 *)(in_RDI + 0x44) = 0;
  *(undefined4 *)(in_RDI + 0x40) = 0;
  _al_mutex_unlock((_AL_MUTEX *)0x174763);
  return;
}

Assistant:

void al_flush_event_queue(ALLEGRO_EVENT_QUEUE *queue)
{
   unsigned int i;
   ASSERT(queue);

   heartbeat();

   _al_mutex_lock(&queue->mutex);

   /* Decrement reference counts on all user events. */
   i = queue->events_tail;
   while (i != queue->events_head) {
      ALLEGRO_EVENT *old_ev = _al_vector_ref(&queue->events, i);
      unref_if_user_event(old_ev);
      i = circ_array_next(&queue->events, i);
   }

   queue->events_head = queue->events_tail = 0;
   _al_mutex_unlock(&queue->mutex);
}